

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

Symbol __thiscall
google::protobuf::DescriptorBuilder::LookupSymbol
          (DescriptorBuilder *this,string *name,string *relative_to,PlaceholderType placeholder_type
          ,ResolveMode resolve_mode)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Tables *pTVar2;
  pointer pcVar3;
  size_type sVar4;
  bool bVar5;
  Type TVar6;
  string *psVar7;
  long lVar8;
  undefined8 *puVar9;
  SourceCodeInfo *pSVar10;
  FileOptions *pFVar11;
  anon_union_8_7_bfa3a334_for_Symbol_2 aVar12;
  EnumOptions *pEVar13;
  MessageOptions *pMVar14;
  EnumValueOptions *pEVar15;
  DescriptorBuilder *this_00;
  Symbol SVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  size_type __dnew;
  string local_70;
  string *local_50;
  string *local_48;
  string *local_40;
  size_type local_38;
  
  this_00 = this;
  SVar16 = LookupSymbolNoPlaceholder(this,name,relative_to,resolve_mode);
  TVar6 = SVar16.type;
  aVar12 = SVar16.field_1;
  if (((TVar6 == NULL_SYMBOL) && (this->pool_->allow_unknown_ == true)) &&
     (bVar5 = ValidateQualifiedName(this_00,name), aVar12 = DAT_002975f8,
     TVar6 = (anonymous_namespace)::kNullSymbol, bVar5)) {
    pTVar2 = this->tables_;
    if (*(name->_M_dataplus)._M_p == '.') {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)name);
      psVar7 = DescriptorPool::Tables::AllocateString(pTVar2,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      psVar7 = DescriptorPool::Tables::AllocateString(pTVar2,name);
    }
    lVar8 = std::__cxx11::string::rfind((char)psVar7,0x2e);
    local_50 = psVar7;
    if (lVar8 == -1) {
      local_40 = (string *)(anonymous_namespace)::kEmptyString_abi_cxx11_;
      local_48 = psVar7;
    }
    else {
      pTVar2 = this->tables_;
      std::__cxx11::string::substr((ulong)&local_70,(ulong)psVar7);
      local_40 = DescriptorPool::Tables::AllocateString(pTVar2,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      pTVar2 = this->tables_;
      std::__cxx11::string::substr((ulong)&local_70,(ulong)local_50);
      local_48 = DescriptorPool::Tables::AllocateString(pTVar2,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    psVar7 = local_50;
    puVar9 = (undefined8 *)DescriptorPool::Tables::AllocateBytes(this->tables_,0xa0);
    memset(puVar9,0,0xa0);
    pSVar10 = SourceCodeInfo::default_instance();
    puVar9[0x13] = pSVar10;
    pTVar2 = this->tables_;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    pcVar3 = (psVar7->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar3,pcVar3 + psVar7->_M_string_length);
    std::__cxx11::string::append((char *)&local_70);
    psVar7 = DescriptorPool::Tables::AllocateString(pTVar2,&local_70);
    *puVar9 = psVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    puVar9[1] = local_40;
    puVar9[2] = this->pool_;
    pFVar11 = FileOptions::default_instance();
    puVar9[0x11] = pFVar11;
    puVar9[0x12] = FileDescriptorTables::kEmpty;
    if (placeholder_type == PLACEHOLDER_ENUM) {
      *(undefined4 *)(puVar9 + 0xb) = 1;
      aVar12.descriptor = (Descriptor *)DescriptorPool::Tables::AllocateBytes(this->tables_,0x38);
      ((anon_union_8_7_bfa3a334_for_Symbol_2 *)(puVar9 + 0xc))->descriptor = (Descriptor *)aVar12;
      *(undefined8 *)aVar12.descriptor = 0;
      *(undefined8 *)(aVar12.descriptor + 8) = 0;
      *(undefined8 *)(aVar12.descriptor + 0x10) = 0;
      *(undefined8 *)(aVar12.descriptor + 0x18) = 0;
      *(undefined8 *)(aVar12.descriptor + 0x20) = 0;
      *(undefined8 *)(aVar12.descriptor + 0x28) = 0;
      *(undefined8 *)(aVar12.descriptor + 0x30) = 0;
      *(string **)(aVar12.descriptor + 8) = local_50;
      *(string **)aVar12.descriptor = local_48;
      *(undefined8 **)(aVar12.descriptor + 0x10) = puVar9;
      pEVar13 = EnumOptions::default_instance();
      *(EnumOptions **)(aVar12.descriptor + 0x20) = pEVar13;
      aVar12.descriptor[0x28] = (Descriptor)0x1;
      aVar12.descriptor[0x29] = (Descriptor)(*(name->_M_dataplus)._M_p != '.');
      *(undefined4 *)(aVar12.descriptor + 0x2c) = 1;
      puVar9 = (undefined8 *)DescriptorPool::Tables::AllocateBytes(this->tables_,0x28);
      *(undefined8 **)(aVar12.descriptor + 0x30) = puVar9;
      *puVar9 = 0;
      puVar9[1] = 0;
      puVar9[2] = 0;
      puVar9[3] = 0;
      puVar9[4] = 0;
      pTVar2 = this->tables_;
      paVar1 = &local_70.field_2;
      local_38 = 0x11;
      local_70._M_dataplus._M_p = (pointer)paVar1;
      local_70._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_70,(ulong)&local_38);
      local_70.field_2._M_allocated_capacity = local_38;
      *(undefined8 *)local_70._M_dataplus._M_p = 0x4c4f484543414c50;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p + 8) = 'D';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p + 9) = 'E';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p + 10) = 'R';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p + 0xb) = '_';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p + 0xc) = 'V';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p + 0xd) = 'A';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p + 0xe) = 'L';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p + 0xf) = 'U';
      local_70._M_dataplus._M_p[0x10] = 'E';
      local_70._M_string_length = local_38;
      local_70._M_dataplus._M_p[local_38] = '\0';
      psVar7 = DescriptorPool::Tables::AllocateString(pTVar2,&local_70);
      *puVar9 = psVar7;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      sVar4 = local_40->_M_string_length;
      if (sVar4 == 0) {
        psVar7 = (string *)*puVar9;
      }
      else {
        pTVar2 = this->tables_;
        pcVar3 = (local_40->_M_dataplus)._M_p;
        local_70._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar3,pcVar3 + local_40->_M_string_length);
        std::__cxx11::string::append((char *)&local_70);
        psVar7 = DescriptorPool::Tables::AllocateString(pTVar2,&local_70);
      }
      puVar9[1] = psVar7;
      if ((sVar4 != 0) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1)) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      *(undefined4 *)(puVar9 + 2) = 0;
      ((anon_union_8_7_bfa3a334_for_Symbol_2 *)(puVar9 + 3))->descriptor = (Descriptor *)aVar12;
      pEVar15 = EnumValueOptions::default_instance();
      puVar9[4] = pEVar15;
      TVar6 = ENUM;
    }
    else {
      *(undefined4 *)(puVar9 + 9) = 1;
      aVar12.descriptor = (Descriptor *)DescriptorPool::Tables::AllocateBytes(this->tables_,0x78);
      ((anon_union_8_7_bfa3a334_for_Symbol_2 *)(puVar9 + 10))->descriptor = (Descriptor *)aVar12;
      *(undefined8 *)aVar12.descriptor = 0;
      *(undefined8 *)(aVar12.descriptor + 8) = 0;
      *(undefined8 *)(aVar12.descriptor + 0x10) = 0;
      *(undefined8 *)(aVar12.descriptor + 0x18) = 0;
      *(undefined8 *)(aVar12.descriptor + 0x20) = 0;
      *(undefined8 *)(aVar12.descriptor + 0x28) = 0;
      *(undefined8 *)(aVar12.descriptor + 0x30) = 0;
      *(undefined8 *)(aVar12.descriptor + 0x38) = 0;
      *(undefined8 *)(aVar12.descriptor + 0x40) = 0;
      *(undefined8 *)(aVar12.descriptor + 0x48) = 0;
      *(undefined8 *)(aVar12.descriptor + 0x50) = 0;
      *(undefined8 *)(aVar12.descriptor + 0x58) = 0;
      *(undefined8 *)(aVar12.descriptor + 0x60) = 0;
      *(undefined8 *)(aVar12.descriptor + 0x68) = 0;
      *(undefined8 *)(aVar12.descriptor + 0x70) = 0;
      *(string **)(aVar12.descriptor + 8) = local_50;
      *(string **)aVar12.descriptor = local_48;
      *(undefined8 **)(aVar12.descriptor + 0x10) = puVar9;
      pMVar14 = MessageOptions::default_instance();
      *(MessageOptions **)(aVar12.descriptor + 0x20) = pMVar14;
      aVar12.descriptor[0x28] = (Descriptor)0x1;
      aVar12.descriptor[0x29] = (Descriptor)(*(name->_M_dataplus)._M_p != '.');
      TVar6 = MESSAGE;
      if (placeholder_type == PLACEHOLDER_EXTENDABLE_MESSAGE) {
        *(undefined4 *)(aVar12.descriptor + 0x58) = 1;
        puVar9 = (undefined8 *)DescriptorPool::Tables::AllocateBytes(this->tables_,8);
        *(undefined8 **)(aVar12.descriptor + 0x60) = puVar9;
        *puVar9 = 0x2000000000000001;
      }
    }
  }
  SVar16._4_4_ = 0;
  SVar16.type = TVar6;
  SVar16.field_1.descriptor = aVar12.descriptor;
  return SVar16;
}

Assistant:

Symbol DescriptorBuilder::LookupSymbol(
    const string& name, const string& relative_to,
    PlaceholderType placeholder_type, ResolveMode resolve_mode) {
  Symbol result = LookupSymbolNoPlaceholder(
      name, relative_to, resolve_mode);
  if (result.IsNull() && pool_->allow_unknown_) {
    // Not found, but AllowUnknownDependencies() is enabled.  Return a
    // placeholder instead.
    result = NewPlaceholder(name, placeholder_type);
  }
  return result;
}